

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns_resolve.cpp
# Opt level: O3

void __thiscall DNSResolve::CallCallback(DNSResolve *this,string *hostname,string *ip)

{
  map<IDNSNotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IDNSNotify_*>,_std::allocator<std::pair<IDNSNotify_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  _Rb_tree_node_base *__x;
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>_>
  *this_01;
  key_type pIVar1;
  pointer pcVar2;
  size_type sVar3;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>
  _Var4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>_>
  pVar5;
  pair<std::_Rb_tree_iterator<std::pair<IDNSNotify_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_iterator<std::pair<IDNSNotify_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  pVar7;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>
  local_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  this_01 = &this->hostname_to_cb_;
  pVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>_>
          ::equal_range(&this_01->_M_t,hostname);
  if (pVar5.first._M_node._M_node != pVar5.second._M_node._M_node) {
    this_00 = &this->cb_to_hostname_;
    do {
      local_98 = pVar5.second._M_node;
      __x = pVar5.first._M_node._M_node + 2;
      sVar3 = std::
              map<IDNSNotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IDNSNotify_*>,_std::allocator<std::pair<IDNSNotify_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::count(this_00,(key_type *)__x);
      if (sVar3 != 0) {
        pVar6 = std::
                _Rb_tree<IDNSNotify_*,_std::pair<IDNSNotify_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<IDNSNotify_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<IDNSNotify_*>,_std::allocator<std::pair<IDNSNotify_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::equal_range(&this_00->_M_t,(key_type *)__x);
        std::
        _Rb_tree<IDNSNotify_*,_std::pair<IDNSNotify_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<IDNSNotify_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<IDNSNotify_*>,_std::allocator<std::pair<IDNSNotify_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar6.first._M_node,(_Base_ptr)pVar6.second._M_node
                      );
      }
      pIVar1 = *(key_type *)__x;
      local_70[0] = local_60;
      pcVar2 = (hostname->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,pcVar2,pcVar2 + hostname->_M_string_length);
      local_90[0] = local_80;
      pcVar2 = (ip->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,pcVar2,pcVar2 + ip->_M_string_length);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
      (*pIVar1->_vptr_IDNSNotify[2])(pIVar1,local_70,local_90,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      if (local_90[0] != local_80) {
        operator_delete(local_90[0]);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
      _Var4._M_node = (_Base_ptr)std::_Rb_tree_increment(pVar5.first._M_node._M_node);
      pVar5.second._M_node = local_98._M_node;
      pVar5.first._M_node = _Var4._M_node;
    } while (_Var4._M_node != local_98._M_node);
    pVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>_>
            ::equal_range(&this_01->_M_t,hostname);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>_>
    ::_M_erase_aux(&this_01->_M_t,(_Base_ptr)pVar5.first._M_node,(_Base_ptr)pVar5.second._M_node);
    pVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::equal_range(&(this->hostname_status_)._M_t,hostname);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::_M_erase_aux(&(this->hostname_status_)._M_t,(_Base_ptr)pVar7.first._M_node,
                   (_Base_ptr)pVar7.second._M_node);
  }
  return;
}

Assistant:

void DNSResolve::CallCallback(string hostname, string ip)
{
    auto cb_range = hostname_to_cb_.equal_range(hostname);
    if (cb_range.first == cb_range.second)
        return;
    while (cb_range.first != cb_range.second)
    {
        if (cb_to_hostname_.count(cb_range.first->second) > 0)
        {
            cb_to_hostname_.erase(cb_range.first->second);
        }
        cb_range.first->second->DNSResolved(hostname, ip, "");
        ++cb_range.first;
    }
    hostname_to_cb_.erase(hostname);
    hostname_status_.erase(hostname);
}